

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestAllTypesLite::set_allocated_oneof_lazy_nested_message
          (TestAllTypesLite *this,TestAllTypesLite_NestedMessage *oneof_lazy_nested_message)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TestAllTypesLite_NestedMessage *oneof_lazy_nested_message_local;
  TestAllTypesLite *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  clear_oneof_field(this);
  if (oneof_lazy_nested_message != (TestAllTypesLite_NestedMessage *)0x0) {
    submessage_arena_00 =
         google::protobuf::MessageLite::GetArena(&oneof_lazy_nested_message->super_MessageLite);
    message_arena = (Arena *)oneof_lazy_nested_message;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<proto2_unittest::TestAllTypesLite_NestedMessage>
                              (message_arena_00,oneof_lazy_nested_message,submessage_arena_00);
    }
    set_has_oneof_lazy_nested_message(this);
    (this->field_0)._impl_.oneof_field_.oneof_nested_message_ = (MessageLite *)message_arena;
  }
  return;
}

Assistant:

void TestAllTypesLite::set_allocated_oneof_lazy_nested_message(::proto2_unittest::TestAllTypesLite_NestedMessage* PROTOBUF_NULLABLE oneof_lazy_nested_message) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_lazy_nested_message) {
    ::google::protobuf::Arena* submessage_arena = oneof_lazy_nested_message->GetArena();
    if (message_arena != submessage_arena) {
      oneof_lazy_nested_message = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_lazy_nested_message, submessage_arena);
    }
    set_has_oneof_lazy_nested_message();
    _impl_.oneof_field_.oneof_lazy_nested_message_ = oneof_lazy_nested_message;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestAllTypesLite.oneof_lazy_nested_message)
}